

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCreateExtPubkey(void *handle,char *extkey,int network_type,char **ext_pubkey)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  allocator local_6a;
  HDWalletApi api;
  string key;
  string local_48;
  
  cfd::Initialize();
  if (ext_pubkey == (char **)0x0) {
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length._0_4_ = 0x75f;
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a1607;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"extpubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. extpubkey is null.",(allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(extkey);
  if (!bVar1) {
    is_bitcoin = true;
    net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      std::__cxx11::string::string((string *)&local_48,extkey,&local_6a);
      cfd::api::HDWalletApi::CreateExtPubkey(&key,&api,&local_48,net_type);
      std::__cxx11::string::~string((string *)&local_48);
      pcVar2 = cfd::capi::CreateString(&key);
      *ext_pubkey = pcVar2;
      std::__cxx11::string::~string((string *)&key);
      return 0;
    }
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length._0_4_ = 0x76e;
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a1607;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. privkey\'s network_type is invalid.",
               (allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key._M_dataplus._M_p = "cfdcapi_key.cpp";
  key._M_string_length._0_4_ = 0x765;
  key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a1607;
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"extkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. extkey is null or empty.",(allocator *)&local_48);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateExtPubkey(
    void* handle, const char* extkey, int network_type, char** ext_pubkey) {
  try {
    cfd::Initialize();
    if (ext_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extpubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extpubkey is null.");
    }
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key = api.CreateExtPubkey(extkey, net_type);
    *ext_pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}